

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O1

UDate icu_63::parseDateTimeString(UnicodeString *str,int32_t offset,UErrorCode *status)

{
  ushort uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint year;
  int32_t iVar5;
  int32_t dom;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  char16_t *pcVar10;
  int iVar11;
  int iVar12;
  double dVar13;
  UDate UVar14;
  
  if (U_ZERO_ERROR < *status) {
    return 0.0;
  }
  uVar1 = (str->fUnion).fStackFields.fLengthAndFlags;
  if ((short)uVar1 < 0) {
    iVar11 = (str->fUnion).fFields.fLength;
  }
  else {
    iVar11 = (int)(short)uVar1 >> 5;
  }
  bVar2 = true;
  if (iVar11 - 0xfU < 2) {
    if (((int)(short)uVar1 & 2U) == 0) {
      pcVar10 = (str->fUnion).fFields.fArray;
    }
    else {
      pcVar10 = (char16_t *)((long)&str->fUnion + 2);
    }
    if (pcVar10[8] == L'T') {
      if (iVar11 == 0x10) {
        if ((uVar1 & 2) == 0) {
          pcVar10 = (str->fUnion).fFields.fArray;
        }
        else {
          pcVar10 = (char16_t *)((long)&str->fUnion + 2);
        }
        bVar2 = true;
        iVar11 = 0;
        dom = 0;
        uVar6 = 0;
        uVar7 = 0;
        uVar8 = 0;
        bVar3 = false;
        year = 0;
        bVar4 = true;
        if (pcVar10[0xf] != L'Z') goto LAB_0020b740;
      }
      else {
        bVar4 = false;
      }
      bVar3 = bVar4;
      year = parseAsciiDigits(str,0,4,status);
      iVar5 = parseAsciiDigits(str,4,2,status);
      iVar11 = iVar5 + -1;
      dom = parseAsciiDigits(str,6,2,status);
      uVar6 = parseAsciiDigits(str,9,2,status);
      uVar7 = parseAsciiDigits(str,0xb,2,status);
      uVar8 = parseAsciiDigits(str,0xd,2,status);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        iVar12 = 0;
        if ((year & 3) == 0) {
          uVar9 = year * -0x3d70a3d7 + 0x51eb850;
          iVar12 = 0xc;
          if ((uVar9 >> 2 | year * 0x40000000) < 0x28f5c29) {
            iVar12 = 0xc;
            if (0xa3d70a < (uVar9 >> 4 | year * -0x70000000)) {
              iVar12 = 0;
            }
          }
        }
        if (((dom < 1) || ((int)year < 0)) || (iVar5 - 0xdU < 0xfffffff4)) {
          bVar2 = true;
        }
        else {
          bVar2 = (0x3b < uVar8 || (0x3b < uVar7 || 0x17 < uVar6)) ||
                  (char)Grego::MONTH_LENGTH[iVar12 + iVar11] < dom;
        }
      }
      else {
        bVar2 = true;
      }
      goto LAB_0020b740;
    }
  }
  iVar11 = 0;
  dom = 0;
  uVar6 = 0;
  uVar7 = 0;
  uVar8 = 0;
  bVar3 = false;
  year = 0;
LAB_0020b740:
  UVar14 = 0.0;
  if (bVar2) {
    *status = U_INVALID_FORMAT_ERROR;
  }
  else {
    dVar13 = Grego::fieldsToDay(year,iVar11,dom);
    UVar14 = (double)(int)(uVar8 * 1000 + uVar7 * 60000 + uVar6 * 3600000) + dVar13 * 86400000.0;
    if (!bVar3) {
      UVar14 = UVar14 - (double)offset;
    }
  }
  return UVar14;
}

Assistant:

static UDate parseDateTimeString(const UnicodeString& str, int32_t offset, UErrorCode& status) {
    if (U_FAILURE(status)) {
        return 0.0;
    }

    int32_t year = 0, month = 0, day = 0, hour = 0, min = 0, sec = 0;
    UBool isUTC = FALSE;
    UBool isValid = FALSE;
    do {
        int length = str.length();
        if (length != 15 && length != 16) {
            // FORM#1 15 characters, such as "20060317T142115"
            // FORM#2 16 characters, such as "20060317T142115Z"
            break;
        }
        if (str.charAt(8) != 0x0054) {
            // charcter "T" must be used for separating date and time
            break;
        }
        if (length == 16) {
            if (str.charAt(15) != 0x005A) {
                // invalid format
                break;
            }
            isUTC = TRUE;
        }

        year = parseAsciiDigits(str, 0, 4, status);
        month = parseAsciiDigits(str, 4, 2, status) - 1;  // 0-based
        day = parseAsciiDigits(str, 6, 2, status);
        hour = parseAsciiDigits(str, 9, 2, status);
        min = parseAsciiDigits(str, 11, 2, status);
        sec = parseAsciiDigits(str, 13, 2, status);

        if (U_FAILURE(status)) {
            break;
        }

        // check valid range
        int32_t maxDayOfMonth = Grego::monthLength(year, month);
        if (year < 0 || month < 0 || month > 11 || day < 1 || day > maxDayOfMonth ||
                hour < 0 || hour >= 24 || min < 0 || min >= 60 || sec < 0 || sec >= 60) {
            break;
        }

        isValid = TRUE;
    } while(false);

    if (!isValid) {
        status = U_INVALID_FORMAT_ERROR;
        return 0.0;
    }
    // Calculate the time
    UDate time = Grego::fieldsToDay(year, month, day) * U_MILLIS_PER_DAY;
    time += (hour * U_MILLIS_PER_HOUR + min * U_MILLIS_PER_MINUTE + sec * U_MILLIS_PER_SECOND);
    if (!isUTC) {
        time -= offset;
    }
    return time;
}